

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

void __thiscall cmCTestCVS::LogParser::FinishRevision(LogParser *this)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  Revision local_110;
  LogParser *local_10;
  LogParser *this_local;
  
  local_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((this->CVS->super_cmCTestVC).Log,"Found revision ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Rev);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"  author = ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->Rev).Author);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"  date = ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->Rev).Date);
    std::operator<<(poVar2,"\n");
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
              (this->Revisions,&this->Rev);
    sVar3 = std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::size
                      (this->Revisions);
    if (1 < sVar3) {
      this->Section = SectionEnd;
    }
  }
  memset(&local_110,0,0x100);
  cmCTestVC::Revision::Revision(&local_110);
  cmCTestVC::Revision::operator=(&this->Rev,&local_110);
  cmCTestVC::Revision::~Revision(&local_110);
  return;
}

Assistant:

void FinishRevision()
  {
    if (!this->Rev.Rev.empty()) {
      // Record this revision.
      /* clang-format off */
      this->CVS->Log << "Found revision " << this->Rev.Rev << "\n"
                     << "  author = " << this->Rev.Author << "\n"
                     << "  date = " << this->Rev.Date << "\n";
      /* clang-format on */
      this->Revisions.push_back(this->Rev);

      // We only need two revisions.
      if (this->Revisions.size() >= 2) {
        this->Section = SectionEnd;
      }
    }
    this->Rev = Revision();
  }